

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFImporter.cpp
# Opt level: O3

aiNode * ImportNode(aiScene *pScene,Asset *r,
                   vector<unsigned_int,_std::allocator<unsigned_int>_> *meshOffsets,
                   Ref<glTF::Node> *ptr)

{
  float fVar1;
  float fVar2;
  float fVar3;
  Node *pNVar4;
  pointer pRVar5;
  pointer pRVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  aiNode *this;
  ulong uVar18;
  aiNode **ppaVar19;
  aiNode *paVar20;
  uint *puVar21;
  pointer puVar22;
  long lVar23;
  uint uVar24;
  pointer pRVar25;
  pointer pRVar26;
  long lVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  
  pNVar4 = (ptr->vector->super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
           super__Vector_impl_data._M_start[ptr->index];
  this = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this,&(pNVar4->super_Object).id);
  pRVar5 = *(pointer *)
            &(pNVar4->children).
             super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>.
             _M_impl;
  pRVar6 = *(pointer *)
            ((long)&(pNVar4->children).
                    super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
            + 8);
  if (pRVar5 != pRVar6) {
    uVar18 = (long)pRVar6 - (long)pRVar5;
    uVar24 = (uint)(uVar18 >> 4);
    this->mNumChildren = uVar24;
    ppaVar19 = (aiNode **)operator_new__(uVar18 >> 1 & 0x7fffffff8);
    this->mChildren = ppaVar19;
    if (uVar24 != 0) {
      lVar23 = 0;
      uVar18 = 0;
      do {
        paVar20 = ImportNode(pScene,r,meshOffsets,
                             (Ref<glTF::Node> *)
                             (*(long *)&(pNVar4->children).
                                        super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                                        ._M_impl + lVar23));
        paVar20->mParent = this;
        this->mChildren[uVar18] = paVar20;
        uVar18 = uVar18 + 1;
        lVar23 = lVar23 + 0x10;
      } while (uVar18 < this->mNumChildren);
    }
  }
  if ((pNVar4->matrix).isPresent == true) {
    (this->mTransformation).a1 = (pNVar4->matrix).value[0];
    (this->mTransformation).b1 = *(float *)((long)(pNVar4->matrix).value + 4);
    (this->mTransformation).c1 = *(float *)((long)(pNVar4->matrix).value + 8);
    (this->mTransformation).d1 = *(float *)((long)(pNVar4->matrix).value + 0xc);
    (this->mTransformation).a2 = *(float *)((long)(pNVar4->matrix).value + 0x10);
    (this->mTransformation).b2 = *(float *)((long)(pNVar4->matrix).value + 0x14);
    (this->mTransformation).c2 = *(float *)((long)(pNVar4->matrix).value + 0x18);
    (this->mTransformation).d2 = *(float *)((long)(pNVar4->matrix).value + 0x1c);
    (this->mTransformation).a3 = *(float *)((long)(pNVar4->matrix).value + 0x20);
    (this->mTransformation).b3 = *(float *)((long)(pNVar4->matrix).value + 0x24);
    (this->mTransformation).c3 = *(float *)((long)(pNVar4->matrix).value + 0x28);
    (this->mTransformation).d3 = *(float *)((long)(pNVar4->matrix).value + 0x2c);
    (this->mTransformation).a4 = *(float *)((long)(pNVar4->matrix).value + 0x30);
    (this->mTransformation).b4 = *(float *)((long)(pNVar4->matrix).value + 0x34);
    (this->mTransformation).c4 = *(float *)((long)(pNVar4->matrix).value + 0x38);
    (this->mTransformation).d4 = *(float *)((long)(pNVar4->matrix).value + 0x3c);
  }
  else {
    if ((pNVar4->translation).isPresent == true) {
      fVar3 = (this->mTransformation).a1;
      fVar44 = (this->mTransformation).a2;
      fVar7 = (this->mTransformation).a3;
      fVar8 = (this->mTransformation).a4;
      fVar9 = (this->mTransformation).b1;
      fVar10 = (this->mTransformation).b2;
      fVar11 = (this->mTransformation).b3;
      fVar12 = (this->mTransformation).b4;
      fVar13 = (this->mTransformation).c1;
      fVar14 = (this->mTransformation).c2;
      fVar15 = (this->mTransformation).c3;
      fVar16 = (this->mTransformation).c4;
      fVar17 = (this->mTransformation).d1;
      fVar28 = (this->mTransformation).d2;
      fVar29 = (this->mTransformation).d3;
      fVar31 = (this->mTransformation).d4;
      fVar35 = fVar3 * 0.0;
      fVar36 = fVar44 * 0.0;
      fVar37 = fVar7 * 0.0;
      fVar38 = fVar8 * 0.0;
      fVar48 = fVar9 * 0.0;
      fVar49 = fVar10 * 0.0;
      fVar50 = fVar11 * 0.0;
      fVar51 = fVar12 * 0.0;
      fVar30 = fVar35 + fVar48;
      fVar32 = fVar36 + fVar49;
      fVar33 = fVar37 + fVar50;
      fVar34 = fVar38 + fVar51;
      fVar39 = fVar13 * 0.0;
      fVar40 = fVar14 * 0.0;
      fVar41 = fVar15 * 0.0;
      fVar42 = fVar16 * 0.0;
      fVar52 = (pNVar4->translation).value[0];
      fVar1 = *(float *)((long)(pNVar4->translation).value + 4);
      fVar2 = *(float *)((long)(pNVar4->translation).value + 8);
      (this->mTransformation).a1 = fVar52 * fVar17 + fVar48 + fVar3 + fVar39;
      (this->mTransformation).a2 = fVar52 * fVar28 + fVar49 + fVar44 + fVar40;
      (this->mTransformation).a3 = fVar52 * fVar29 + fVar50 + fVar7 + fVar41;
      (this->mTransformation).a4 = fVar52 * fVar31 + fVar51 + fVar8 + fVar42;
      (this->mTransformation).b1 = fVar1 * fVar17 + fVar35 + fVar9 + fVar39;
      (this->mTransformation).b2 = fVar1 * fVar28 + fVar36 + fVar10 + fVar40;
      (this->mTransformation).b3 = fVar1 * fVar29 + fVar37 + fVar11 + fVar41;
      (this->mTransformation).b4 = fVar1 * fVar31 + fVar38 + fVar12 + fVar42;
      (this->mTransformation).c1 = fVar2 * fVar17 + fVar30 + fVar13;
      (this->mTransformation).c2 = fVar2 * fVar28 + fVar32 + fVar14;
      (this->mTransformation).c3 = fVar2 * fVar29 + fVar33 + fVar15;
      (this->mTransformation).c4 = fVar2 * fVar31 + fVar34 + fVar16;
      (this->mTransformation).d1 = fVar39 + fVar30 + fVar17;
      (this->mTransformation).d2 = fVar40 + fVar32 + fVar28;
      (this->mTransformation).d3 = fVar41 + fVar33 + fVar29;
      (this->mTransformation).d4 = fVar42 + fVar34 + fVar31;
    }
    if ((pNVar4->scale).isPresent == true) {
      fVar3 = (this->mTransformation).a1;
      fVar44 = (this->mTransformation).a2;
      fVar7 = (this->mTransformation).a3;
      fVar8 = (this->mTransformation).a4;
      fVar9 = (this->mTransformation).b1;
      fVar10 = (this->mTransformation).b2;
      fVar11 = (this->mTransformation).b3;
      fVar12 = (this->mTransformation).b4;
      fVar13 = (this->mTransformation).c1;
      fVar14 = (this->mTransformation).c2;
      fVar15 = (this->mTransformation).c3;
      fVar16 = (this->mTransformation).c4;
      fVar17 = (this->mTransformation).d1;
      fVar28 = (this->mTransformation).d2;
      fVar29 = (this->mTransformation).d3;
      fVar31 = (this->mTransformation).d4;
      fVar52 = *(float *)((long)(pNVar4->scale).value + 4);
      fVar43 = fVar9 * 0.0;
      fVar45 = fVar10 * 0.0;
      fVar46 = fVar11 * 0.0;
      fVar47 = fVar12 * 0.0;
      fVar1 = (pNVar4->scale).value[0];
      fVar39 = fVar3 * 0.0;
      fVar41 = fVar44 * 0.0;
      fVar48 = fVar7 * 0.0;
      fVar50 = fVar8 * 0.0;
      fVar40 = fVar39 + fVar43;
      fVar42 = fVar41 + fVar45;
      fVar49 = fVar48 + fVar46;
      fVar51 = fVar50 + fVar47;
      fVar2 = *(float *)((long)(pNVar4->scale).value + 8);
      fVar35 = fVar13 * 0.0;
      fVar36 = fVar14 * 0.0;
      fVar37 = fVar15 * 0.0;
      fVar38 = fVar16 * 0.0;
      fVar30 = fVar17 * 0.0;
      fVar32 = fVar28 * 0.0;
      fVar33 = fVar29 * 0.0;
      fVar34 = fVar31 * 0.0;
      (this->mTransformation).a1 = fVar1 * fVar3 + fVar43 + fVar35 + fVar30;
      (this->mTransformation).a2 = fVar1 * fVar44 + fVar45 + fVar36 + fVar32;
      (this->mTransformation).a3 = fVar1 * fVar7 + fVar46 + fVar37 + fVar33;
      (this->mTransformation).a4 = fVar1 * fVar8 + fVar47 + fVar38 + fVar34;
      (this->mTransformation).b1 = fVar52 * fVar9 + fVar39 + fVar35 + fVar30;
      (this->mTransformation).b2 = fVar52 * fVar10 + fVar41 + fVar36 + fVar32;
      (this->mTransformation).b3 = fVar52 * fVar11 + fVar48 + fVar37 + fVar33;
      (this->mTransformation).b4 = fVar52 * fVar12 + fVar50 + fVar38 + fVar34;
      (this->mTransformation).c1 = fVar2 * fVar13 + fVar40 + fVar30;
      (this->mTransformation).c2 = fVar2 * fVar14 + fVar42 + fVar32;
      (this->mTransformation).c3 = fVar2 * fVar15 + fVar49 + fVar33;
      (this->mTransformation).c4 = fVar2 * fVar16 + fVar51 + fVar34;
      (this->mTransformation).d1 = fVar35 + fVar40 + fVar17;
      (this->mTransformation).d2 = fVar36 + fVar42 + fVar28;
      (this->mTransformation).d3 = fVar37 + fVar49 + fVar29;
      (this->mTransformation).d4 = fVar38 + fVar51 + fVar31;
    }
    if ((pNVar4->rotation).isPresent == true) {
      fVar52 = (pNVar4->rotation).value[0];
      fVar1 = *(float *)((long)(pNVar4->rotation).value + 4);
      fVar2 = *(float *)((long)(pNVar4->rotation).value + 8);
      fVar3 = *(float *)((long)(pNVar4->rotation).value + 0xc);
      fVar44 = fVar1 * fVar1 + fVar2 * fVar2;
      fVar32 = 1.0 - (fVar44 + fVar44);
      fVar33 = fVar52 * fVar1 - fVar2 * fVar3;
      fVar33 = fVar33 + fVar33;
      fVar34 = fVar52 * fVar2 + fVar1 * fVar3;
      fVar34 = fVar34 + fVar34;
      fVar29 = fVar2 * fVar3 + fVar52 * fVar1;
      fVar29 = fVar29 + fVar29;
      fVar44 = fVar2 * fVar2 + fVar52 * fVar52;
      fVar35 = 1.0 - (fVar44 + fVar44);
      fVar36 = fVar1 * fVar2 - fVar52 * fVar3;
      fVar36 = fVar36 + fVar36;
      fVar31 = fVar52 * fVar2 - fVar1 * fVar3;
      fVar31 = fVar31 + fVar31;
      fVar28 = fVar52 * fVar3 + fVar1 * fVar2;
      fVar28 = fVar28 + fVar28;
      fVar52 = fVar52 * fVar52 + fVar1 * fVar1;
      fVar30 = 1.0 - (fVar52 + fVar52);
      fVar52 = (this->mTransformation).a1;
      fVar1 = (this->mTransformation).a2;
      fVar2 = (this->mTransformation).a3;
      fVar3 = (this->mTransformation).a4;
      fVar44 = (this->mTransformation).b1;
      fVar7 = (this->mTransformation).b2;
      fVar8 = (this->mTransformation).b3;
      fVar9 = (this->mTransformation).b4;
      fVar10 = (this->mTransformation).c1;
      fVar11 = (this->mTransformation).c2;
      fVar12 = (this->mTransformation).c3;
      fVar13 = (this->mTransformation).c4;
      fVar14 = (this->mTransformation).d1;
      fVar15 = (this->mTransformation).d2;
      fVar16 = (this->mTransformation).d3;
      fVar17 = (this->mTransformation).d4;
      fVar37 = fVar14 * 0.0;
      fVar38 = fVar15 * 0.0;
      fVar39 = fVar16 * 0.0;
      fVar40 = fVar17 * 0.0;
      (this->mTransformation).a1 = fVar34 * fVar10 + fVar32 * fVar52 + fVar33 * fVar44 + fVar37;
      (this->mTransformation).a2 = fVar34 * fVar11 + fVar32 * fVar1 + fVar33 * fVar7 + fVar38;
      (this->mTransformation).a3 = fVar34 * fVar12 + fVar32 * fVar2 + fVar33 * fVar8 + fVar39;
      (this->mTransformation).a4 = fVar34 * fVar13 + fVar32 * fVar3 + fVar33 * fVar9 + fVar40;
      (this->mTransformation).b1 = fVar36 * fVar10 + fVar29 * fVar52 + fVar35 * fVar44 + fVar37;
      (this->mTransformation).b2 = fVar36 * fVar11 + fVar29 * fVar1 + fVar35 * fVar7 + fVar38;
      (this->mTransformation).b3 = fVar36 * fVar12 + fVar29 * fVar2 + fVar35 * fVar8 + fVar39;
      (this->mTransformation).b4 = fVar36 * fVar13 + fVar29 * fVar3 + fVar35 * fVar9 + fVar40;
      (this->mTransformation).c1 = fVar30 * fVar10 + fVar31 * fVar52 + fVar28 * fVar44 + fVar37;
      (this->mTransformation).c2 = fVar30 * fVar11 + fVar31 * fVar1 + fVar28 * fVar7 + fVar38;
      (this->mTransformation).c3 = fVar30 * fVar12 + fVar31 * fVar2 + fVar28 * fVar8 + fVar39;
      (this->mTransformation).c4 = fVar30 * fVar13 + fVar31 * fVar3 + fVar28 * fVar9 + fVar40;
      (this->mTransformation).d1 = fVar10 * 0.0 + fVar52 * 0.0 + fVar44 * 0.0 + fVar14;
      (this->mTransformation).d2 = fVar11 * 0.0 + fVar1 * 0.0 + fVar7 * 0.0 + fVar15;
      (this->mTransformation).d3 = fVar12 * 0.0 + fVar2 * 0.0 + fVar8 * 0.0 + fVar16;
      (this->mTransformation).d4 = fVar13 * 0.0 + fVar3 * 0.0 + fVar9 * 0.0 + fVar17;
    }
  }
  pRVar25 = *(pointer *)
             &(pNVar4->meshes).
              super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>.
              _M_impl;
  pRVar26 = *(pointer *)
             ((long)&(pNVar4->meshes).
                     super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
             + 8);
  if (pRVar25 != pRVar26) {
    lVar23 = (long)pRVar26 - (long)pRVar25 >> 4;
    puVar22 = (meshOffsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
              .super__Vector_impl_data._M_start;
    lVar23 = lVar23 + (ulong)(lVar23 == 0);
    puVar21 = &pRVar25->index;
    uVar24 = 0;
    do {
      uVar24 = (uVar24 + puVar22[(long)(int)*puVar21 + 1]) - puVar22[(int)*puVar21];
      puVar21 = puVar21 + 4;
      lVar23 = lVar23 + -1;
    } while (lVar23 != 0);
    this->mNumMeshes = uVar24;
    uVar18 = 0xffffffffffffffff;
    if (-1 < (int)uVar24) {
      uVar18 = (long)(int)uVar24 * 4;
    }
    puVar21 = (uint *)operator_new__(uVar18);
    this->mMeshes = puVar21;
    pRVar25 = *(pointer *)
               &(pNVar4->meshes).
                super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>.
                _M_impl;
    pRVar26 = *(pointer *)
               ((long)&(pNVar4->meshes).
                       super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
               + 8);
    if (pRVar26 != pRVar25) {
      puVar22 = (meshOffsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start;
      uVar18 = 0;
      lVar23 = 0;
      do {
        lVar27 = (long)(int)pRVar25[uVar18].index;
        uVar24 = puVar22[lVar27];
        if (uVar24 < puVar22[lVar27 + 1]) {
          lVar23 = (long)(int)lVar23;
          do {
            this->mMeshes[lVar23] = uVar24;
            uVar24 = uVar24 + 1;
            lVar23 = lVar23 + 1;
            puVar22 = (meshOffsets->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (uVar24 < puVar22[lVar27 + 1]);
          pRVar25 = *(pointer *)
                     &(pNVar4->meshes).
                      super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
                      ._M_impl;
          pRVar26 = *(pointer *)
                     ((long)&(pNVar4->meshes).
                             super__Vector_base<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>
                     + 8);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < (ulong)((long)pRVar26 - (long)pRVar25 >> 4));
    }
  }
  if (((pNVar4->camera).vector != (vector<glTF::Camera_*,_std::allocator<glTF::Camera_*>_> *)0x0) &&
     (paVar20 = (aiNode *)pScene->mCameras[(pNVar4->camera).index], paVar20 != this)) {
    uVar24 = (this->mName).length;
    (paVar20->mName).length = uVar24;
    memcpy((paVar20->mName).data,(this->mName).data,(ulong)uVar24);
    (paVar20->mName).data[uVar24] = '\0';
  }
  if (((pNVar4->light).vector != (vector<glTF::Light_*,_std::allocator<glTF::Light_*>_> *)0x0) &&
     (paVar20 = (aiNode *)pScene->mLights[(pNVar4->light).index], paVar20 != this)) {
    uVar24 = (this->mName).length;
    (paVar20->mName).length = uVar24;
    memcpy((paVar20->mName).data,(this->mName).data,(ulong)uVar24);
    (paVar20->mName).data[uVar24] = '\0';
  }
  return this;
}

Assistant:

aiNode* ImportNode(aiScene* pScene, glTF::Asset& r, std::vector<unsigned int>& meshOffsets, glTF::Ref<glTF::Node>& ptr)
{
    Node& node = *ptr;

    aiNode* ainode = new aiNode(node.id);

    if (!node.children.empty()) {
        ainode->mNumChildren = unsigned(node.children.size());
        ainode->mChildren = new aiNode*[ainode->mNumChildren];

        for (unsigned int i = 0; i < ainode->mNumChildren; ++i) {
            aiNode* child = ImportNode(pScene, r, meshOffsets, node.children[i]);
            child->mParent = ainode;
            ainode->mChildren[i] = child;
        }
    }

    aiMatrix4x4& matrix = ainode->mTransformation;
    if (node.matrix.isPresent) {
        CopyValue(node.matrix.value, matrix);
    }
    else {
        if (node.translation.isPresent) {
            aiVector3D trans;
            CopyValue(node.translation.value, trans);
            aiMatrix4x4 t;
            aiMatrix4x4::Translation(trans, t);
            matrix = t * matrix;
        }

        if (node.scale.isPresent) {
            aiVector3D scal(1.f);
            CopyValue(node.scale.value, scal);
            aiMatrix4x4 s;
            aiMatrix4x4::Scaling(scal, s);
            matrix = s * matrix;
        }


        if (node.rotation.isPresent) {
            aiQuaternion rot;
            CopyValue(node.rotation.value, rot);
            matrix = aiMatrix4x4(rot.GetMatrix()) * matrix;
        }
    }

    if (!node.meshes.empty()) {
        int count = 0;
        for (size_t i = 0; i < node.meshes.size(); ++i) {
            int idx = node.meshes[i].GetIndex();
            count += meshOffsets[idx + 1] - meshOffsets[idx];
        }

        ainode->mNumMeshes = count;
        ainode->mMeshes = new unsigned int[count];

        int k = 0;
        for (size_t i = 0; i < node.meshes.size(); ++i) {
            int idx = node.meshes[i].GetIndex();
            for (unsigned int j = meshOffsets[idx]; j < meshOffsets[idx + 1]; ++j, ++k) {
                ainode->mMeshes[k] = j;
            }
        }
    }

    if (node.camera) {
        pScene->mCameras[node.camera.GetIndex()]->mName = ainode->mName;
    }

    if (node.light) {
        pScene->mLights[node.light.GetIndex()]->mName = ainode->mName;
    }

    return ainode;
}